

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O3

void pffft_zreorder(PFFFT_Setup *setup,float *in,float *out,pffft_direction_t direction)

{
  uint uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  if (in == out) {
    __assert_fail("in != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x51a,
                  "void pffft_zreorder(PFFFT_Setup *, const float *, float *, pffft_direction_t)");
  }
  if (setup->transform != PFFFT_REAL) {
    uVar1 = setup->Ncvec;
    if (direction == PFFFT_FORWARD) {
      if ((int)uVar1 < 1) {
        return;
      }
      pfVar9 = in + 4;
      uVar12 = 0;
      do {
        iVar14 = ((uint)uVar12 & 3) * (uVar1 >> 2) + ((uint)(uVar12 >> 2) & 0x3fffffff);
        fVar16 = pfVar9[-4];
        fVar17 = pfVar9[-3];
        fVar18 = pfVar9[-1];
        fVar19 = *pfVar9;
        fVar20 = pfVar9[1];
        fVar21 = pfVar9[2];
        fVar22 = pfVar9[3];
        pfVar10 = out + (ulong)(iVar14 * 2 + 1) * 4;
        *pfVar10 = pfVar9[-2];
        pfVar10[1] = fVar21;
        pfVar10[2] = fVar18;
        pfVar10[3] = fVar22;
        pfVar10 = out + (ulong)(uint)(iVar14 * 2) * 4;
        *pfVar10 = fVar16;
        pfVar10[1] = fVar19;
        pfVar10[2] = fVar17;
        pfVar10[3] = fVar20;
        uVar12 = uVar12 + 1;
        pfVar9 = pfVar9 + 8;
      } while (uVar1 != uVar12);
      return;
    }
    if ((int)uVar1 < 1) {
      return;
    }
    pfVar9 = out + 4;
    uVar12 = 0;
    do {
      iVar14 = ((uint)uVar12 & 3) * (uVar1 >> 2) + ((uint)(uVar12 >> 2) & 0x3fffffff);
      pfVar10 = in + (ulong)(uint)(iVar14 * 2) * 4;
      fVar16 = *pfVar10;
      fVar17 = pfVar10[2];
      fVar18 = pfVar10[3];
      pfVar11 = in + (ulong)(iVar14 * 2 + 1) * 4;
      fVar19 = *pfVar11;
      fVar20 = pfVar11[1];
      fVar21 = pfVar11[2];
      fVar22 = pfVar11[3];
      *pfVar9 = pfVar10[1];
      pfVar9[1] = fVar18;
      pfVar9[2] = fVar20;
      pfVar9[3] = fVar22;
      pfVar9[-4] = fVar16;
      pfVar9[-3] = fVar17;
      pfVar9[-2] = fVar19;
      pfVar9[-1] = fVar21;
      uVar12 = uVar12 + 1;
      pfVar9 = pfVar9 + 8;
    } while (uVar1 != uVar12);
    return;
  }
  uVar1 = setup->N;
  uVar13 = (ulong)(int)uVar1;
  uVar12 = (ulong)uVar1;
  uVar7 = uVar1 + 0x1f;
  if (-1 < (int)uVar1) {
    uVar7 = uVar1;
  }
  uVar7 = (int)uVar7 >> 5;
  if (direction == PFFFT_FORWARD) {
    if (0x1f < (int)uVar1) {
      lVar15 = 0;
      do {
        pfVar9 = in + lVar15;
        fVar16 = *pfVar9;
        fVar17 = pfVar9[1];
        fVar18 = pfVar9[3];
        pfVar10 = in + lVar15 + 4;
        fVar19 = *pfVar10;
        fVar20 = pfVar10[1];
        fVar21 = pfVar10[2];
        fVar22 = pfVar10[3];
        pfVar10 = (float *)((long)out + lVar15 + 0x10);
        *pfVar10 = pfVar9[2];
        pfVar10[1] = fVar21;
        pfVar10[2] = fVar18;
        pfVar10[3] = fVar22;
        pfVar9 = (float *)((long)out + lVar15);
        *pfVar9 = fVar16;
        pfVar9[1] = fVar19;
        pfVar9[2] = fVar17;
        pfVar9[3] = fVar20;
        pfVar10 = in + lVar15 + 0x10;
        fVar16 = *pfVar10;
        fVar17 = pfVar10[1];
        fVar18 = pfVar10[3];
        pfVar9 = in + lVar15 + 0x14;
        fVar19 = *pfVar9;
        fVar20 = pfVar9[1];
        fVar21 = pfVar9[2];
        fVar22 = pfVar9[3];
        pfVar9 = (float *)((long)out + lVar15 + (ulong)(uVar7 * 4) * 0x10 + 0x10);
        *pfVar9 = pfVar10[2];
        pfVar9[1] = fVar21;
        pfVar9[2] = fVar18;
        pfVar9[3] = fVar22;
        pfVar9 = (float *)((long)out + lVar15 + (ulong)(uVar7 * 4) * 0x10);
        *pfVar9 = fVar16;
        pfVar9[1] = fVar19;
        pfVar9[2] = fVar17;
        pfVar9[3] = fVar20;
        lVar15 = lVar15 + 0x20;
      } while ((ulong)uVar7 << 5 != lVar15);
    }
    iVar14 = (int)uVar1 / 2;
    fVar16 = in[8];
    fVar17 = in[9];
    fVar18 = in[0xb];
    fVar19 = in[0xc];
    fVar20 = in[0xd];
    fVar21 = in[0xe];
    fVar22 = in[0xf];
    pfVar9 = out + (long)iVar14 + -4;
    *pfVar9 = in[10];
    out[(long)iVar14 + -3] = fVar21;
    out[(long)iVar14 + -2] = fVar17;
    out[(long)iVar14 + -1] = fVar20;
    if (0x3f < (int)uVar1) {
      pfVar10 = in + 0x2c;
      iVar14 = uVar7 - 1;
      fVar17 = fVar18;
      fVar20 = fVar22;
      do {
        fVar21 = pfVar10[-3];
        fVar3 = pfVar10[-2];
        fVar18 = pfVar10[-1];
        fVar4 = *pfVar10;
        fVar5 = pfVar10[1];
        fVar6 = pfVar10[2];
        fVar22 = pfVar10[3];
        pfVar9[-4] = pfVar10[-4];
        pfVar9[-3] = fVar4;
        pfVar9[-2] = fVar17;
        pfVar9[-1] = fVar20;
        pfVar9[-8] = fVar3;
        pfVar9[-7] = fVar6;
        pfVar9[-6] = fVar21;
        pfVar9[-5] = fVar5;
        pfVar9 = pfVar9 + -8;
        pfVar10 = pfVar10 + 0x20;
        iVar14 = iVar14 + -1;
        fVar17 = fVar18;
        fVar20 = fVar22;
      } while (iVar14 != 0);
    }
    pfVar9[-4] = fVar16;
    pfVar9[-3] = fVar19;
    pfVar9[-2] = fVar18;
    pfVar9[-1] = fVar22;
    fVar16 = in[0x18];
    fVar17 = in[0x19];
    fVar18 = in[0x1b];
    fVar19 = in[0x1c];
    fVar20 = in[0x1d];
    fVar21 = in[0x1e];
    fVar22 = in[0x1f];
    pfVar9 = out + (uVar13 - 4);
    *pfVar9 = in[0x1a];
    out[uVar13 - 3] = fVar21;
    out[uVar13 - 2] = fVar17;
    out[uVar13 - 1] = fVar20;
    if (0x3f < (int)uVar1) {
      pfVar10 = in + 0x3c;
      iVar14 = uVar7 - 1;
      fVar17 = fVar18;
      fVar20 = fVar22;
      do {
        fVar21 = pfVar10[-3];
        fVar3 = pfVar10[-2];
        fVar18 = pfVar10[-1];
        fVar4 = *pfVar10;
        fVar5 = pfVar10[1];
        fVar6 = pfVar10[2];
        fVar22 = pfVar10[3];
        pfVar9[-4] = pfVar10[-4];
        pfVar9[-3] = fVar4;
        pfVar9[-2] = fVar17;
        pfVar9[-1] = fVar20;
        pfVar9[-8] = fVar3;
        pfVar9[-7] = fVar6;
        pfVar9[-6] = fVar21;
        pfVar9[-5] = fVar5;
        pfVar9 = pfVar9 + -8;
        pfVar10 = pfVar10 + 0x20;
        iVar14 = iVar14 + -1;
        fVar17 = fVar18;
        fVar20 = fVar22;
      } while (iVar14 != 0);
    }
    pfVar9[-4] = fVar16;
    pfVar9[-3] = fVar19;
    pfVar9[-2] = fVar18;
    pfVar9[-1] = fVar22;
    return;
  }
  if ((int)uVar1 < 0x20) {
    uVar8 = uVar1 + 3;
    if (-1 < (int)uVar1) {
      uVar8 = uVar1;
    }
    pfVar10 = out + (uVar13 - 0x18);
    pfVar9 = in + ((int)uVar8 >> 2);
    pfVar11 = pfVar9 + 4;
    fVar16 = *pfVar9;
    fVar17 = pfVar9[1];
    fVar18 = pfVar9[2];
    fVar19 = pfVar9[3];
    uVar12 = uVar13;
  }
  else {
    lVar15 = 0;
    do {
      pfVar9 = (float *)((long)in + lVar15);
      fVar16 = *pfVar9;
      fVar17 = pfVar9[2];
      fVar18 = pfVar9[3];
      pfVar10 = (float *)((long)in + lVar15 + 0x10);
      fVar19 = *pfVar10;
      fVar20 = pfVar10[1];
      fVar21 = pfVar10[2];
      fVar22 = pfVar10[3];
      pfVar10 = out + lVar15 + 4;
      *pfVar10 = pfVar9[1];
      pfVar10[1] = fVar18;
      pfVar10[2] = fVar20;
      pfVar10[3] = fVar22;
      pfVar9 = out + lVar15;
      *pfVar9 = fVar16;
      pfVar9[1] = fVar17;
      pfVar9[2] = fVar19;
      pfVar9[3] = fVar21;
      pfVar10 = (float *)((long)in + lVar15 + (ulong)(uVar7 * 4) * 0x10);
      fVar16 = *pfVar10;
      fVar17 = pfVar10[2];
      fVar18 = pfVar10[3];
      pfVar9 = (float *)((long)in + lVar15 + (ulong)(uVar7 * 4) * 0x10 + 0x10);
      fVar19 = *pfVar9;
      fVar20 = pfVar9[1];
      fVar21 = pfVar9[2];
      fVar22 = pfVar9[3];
      pfVar9 = out + lVar15 + 0x14;
      *pfVar9 = pfVar10[1];
      pfVar9[1] = fVar18;
      pfVar9[2] = fVar20;
      pfVar9[3] = fVar22;
      pfVar9 = out + lVar15 + 0x10;
      *pfVar9 = fVar16;
      pfVar9[1] = fVar17;
      pfVar9[2] = fVar19;
      pfVar9[3] = fVar21;
      lVar15 = lVar15 + 0x20;
    } while ((ulong)uVar7 << 5 != lVar15);
    pfVar10 = out + (uVar12 - 0x18);
    pfVar9 = (float *)((long)in + (ulong)(uVar1 & 0xfffffffc));
    pfVar11 = pfVar9 + 4;
    fVar16 = *pfVar9;
    fVar17 = pfVar9[1];
    fVar18 = pfVar9[2];
    fVar19 = pfVar9[3];
    bVar2 = 0x3f < (int)uVar1;
    if (0x3f < (int)uVar1) {
      iVar14 = uVar7 - 1;
      fVar20 = fVar18;
      fVar21 = fVar19;
      do {
        fVar22 = *pfVar11;
        fVar3 = pfVar11[1];
        fVar4 = pfVar11[2];
        fVar5 = pfVar11[3];
        fVar6 = pfVar11[4];
        pfVar9 = pfVar11 + 5;
        fVar18 = pfVar11[6];
        fVar19 = pfVar11[7];
        pfVar11 = pfVar11 + 8;
        pfVar10[4] = *pfVar9;
        pfVar10[5] = fVar5;
        pfVar10[6] = fVar3;
        pfVar10[7] = fVar21;
        *pfVar10 = fVar6;
        pfVar10[1] = fVar4;
        pfVar10[2] = fVar22;
        pfVar10[3] = fVar20;
        pfVar10 = pfVar10 + -0x20;
        iVar14 = iVar14 + -1;
        fVar20 = fVar18;
        fVar21 = fVar19;
      } while (iVar14 != 0);
      goto LAB_001079d4;
    }
  }
  bVar2 = false;
LAB_001079d4:
  fVar20 = *pfVar11;
  fVar21 = pfVar11[1];
  fVar22 = pfVar11[2];
  fVar3 = pfVar11[3];
  pfVar10[4] = fVar17;
  pfVar10[5] = fVar3;
  pfVar10[6] = fVar21;
  pfVar10[7] = fVar19;
  *pfVar10 = fVar16;
  pfVar10[1] = fVar22;
  pfVar10[2] = fVar20;
  pfVar10[3] = fVar18;
  iVar14 = uVar1 * 3 + 3;
  if (-1 < (int)(uVar1 * 3)) {
    iVar14 = uVar1 * 3;
  }
  pfVar10 = out + (uVar12 - 8);
  pfVar9 = in + (iVar14 >> 2);
  pfVar11 = pfVar9 + 4;
  fVar16 = *pfVar9;
  fVar17 = pfVar9[1];
  fVar18 = pfVar9[2];
  fVar19 = pfVar9[3];
  if (bVar2) {
    iVar14 = uVar7 - 1;
    fVar20 = fVar18;
    fVar21 = fVar19;
    do {
      fVar22 = *pfVar11;
      fVar3 = pfVar11[1];
      fVar4 = pfVar11[2];
      fVar5 = pfVar11[3];
      fVar6 = pfVar11[4];
      pfVar9 = pfVar11 + 5;
      fVar18 = pfVar11[6];
      fVar19 = pfVar11[7];
      pfVar11 = pfVar11 + 8;
      pfVar10[4] = *pfVar9;
      pfVar10[5] = fVar5;
      pfVar10[6] = fVar3;
      pfVar10[7] = fVar21;
      *pfVar10 = fVar6;
      pfVar10[1] = fVar4;
      pfVar10[2] = fVar22;
      pfVar10[3] = fVar20;
      pfVar10 = pfVar10 + -0x20;
      iVar14 = iVar14 + -1;
      fVar20 = fVar18;
      fVar21 = fVar19;
    } while (iVar14 != 0);
  }
  fVar20 = *pfVar11;
  fVar21 = pfVar11[1];
  fVar22 = pfVar11[2];
  fVar3 = pfVar11[3];
  pfVar10[4] = fVar17;
  pfVar10[5] = fVar3;
  pfVar10[6] = fVar21;
  pfVar10[7] = fVar19;
  *pfVar10 = fVar16;
  pfVar10[1] = fVar22;
  pfVar10[2] = fVar20;
  pfVar10[3] = fVar18;
  return;
}

Assistant:

void pffft_zreorder(PFFFT_Setup *setup, const float *in, float *out, pffft_direction_t direction) {
  int k, N = setup->N, Ncvec = setup->Ncvec;
  const v4sf *vin = (const v4sf*)in;
  v4sf *vout = (v4sf*)out;
  assert(in != out);
  if (setup->transform == PFFFT_REAL) {
    int k, dk = N/32;
    if (direction == PFFFT_FORWARD) {
      for (k=0; k < dk; ++k) {
        INTERLEAVE2(vin[k*8 + 0], vin[k*8 + 1], vout[2*(0*dk + k) + 0], vout[2*(0*dk + k) + 1]);
        INTERLEAVE2(vin[k*8 + 4], vin[k*8 + 5], vout[2*(2*dk + k) + 0], vout[2*(2*dk + k) + 1]);
      }
      reversed_copy(dk, vin+2, 8, (v4sf*)(out + N/2));
      reversed_copy(dk, vin+6, 8, (v4sf*)(out + N));
    } else {
      for (k=0; k < dk; ++k) {
        UNINTERLEAVE2(vin[2*(0*dk + k) + 0], vin[2*(0*dk + k) + 1], vout[k*8 + 0], vout[k*8 + 1]);
        UNINTERLEAVE2(vin[2*(2*dk + k) + 0], vin[2*(2*dk + k) + 1], vout[k*8 + 4], vout[k*8 + 5]);
      }
      unreversed_copy(dk, (v4sf*)(in + N/4), (v4sf*)(out + N - 6*SIMD_SZ), -8);
      unreversed_copy(dk, (v4sf*)(in + 3*N/4), (v4sf*)(out + N - 2*SIMD_SZ), -8);
    }
  } else {
    if (direction == PFFFT_FORWARD) {
      for (k=0; k < Ncvec; ++k) { 
        int kk = (k/4) + (k%4)*(Ncvec/4);
        INTERLEAVE2(vin[k*2], vin[k*2+1], vout[kk*2], vout[kk*2+1]);
      }
    } else {
      for (k=0; k < Ncvec; ++k) { 
        int kk = (k/4) + (k%4)*(Ncvec/4);
        UNINTERLEAVE2(vin[kk*2], vin[kk*2+1], vout[k*2], vout[k*2+1]);
      }
    }
  }
}